

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Member.h
# Opt level: O0

Address * __thiscall Address::getAddress_abi_cxx11_(Address *this)

{
  int *in_RSI;
  __cxx11 local_90 [48];
  __cxx11 local_60 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40 [34];
  short local_1e;
  int local_1c;
  short port;
  int id;
  Address *this_local;
  
  local_1c = *in_RSI;
  local_1e = (short)in_RSI[1];
  this_local = this;
  std::__cxx11::to_string(local_60,local_1c);
  std::operator+(local_40,(char *)local_60);
  std::__cxx11::to_string(local_90,(int)local_1e);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,local_40)
  ;
  std::__cxx11::string::~string((string *)local_90);
  std::__cxx11::string::~string((string *)local_40);
  std::__cxx11::string::~string((string *)local_60);
  return this;
}

Assistant:

string getAddress() {
		int id = 0;
		short port;
		memcpy(&id, &addr[0], sizeof(int));
		memcpy(&port, &addr[4], sizeof(short));
		return to_string(id) + ":" + to_string(port);
	}